

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O0

void search_motion_mode(AV1_COMP *cpi,MACROBLOCK *x,RD_STATS *this_rdc,int mi_row,int mi_col,
                       BLOCK_SIZE bsize,int *this_early_term,int use_model_yrd_large,int *rate_mv,
                       int64_t best_sse)

{
  InterpFilter filter;
  uint8_t uVar1;
  int iVar2;
  int_interpfilters iVar3;
  uint uVar4;
  int_mv iVar5;
  long lVar6;
  undefined4 in_ECX;
  int *in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  byte in_R9B;
  int *in_stack_00000008;
  int in_stack_00000010;
  int *in_stack_00000018;
  MACROBLOCK *in_stack_00000020;
  int tmp_rate_mv;
  SUBPEL_MOTION_SEARCH_PARAMS ms_params;
  int_mv ref_mv;
  int num_proj_ref0;
  WarpedMotionParams wm_params0;
  int_mv mv0;
  ModeCosts *mode_costs;
  int pts_inref [16];
  int pts [16];
  MOTION_MODE motion_mode;
  int64_t cost;
  int mode_index;
  MB_MODE_INFO best_mbmi;
  MB_MODE_INFO base_mbmi;
  int total_samples;
  int *pts_inref0;
  int *pts0;
  WARP_SAMPLE_INFO *warp_sample_info;
  int mode_search_size;
  MOTION_MODE motion_modes [2];
  int interp_filter;
  int best_mode_index;
  int64_t best_cost;
  int best_early_term;
  int best_skip;
  RD_STATS pf_rd_stats [2];
  MB_MODE_INFO *mi;
  FeatureFlags *features;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  MACROBLOCKD *in_stack_00000b50;
  MACROBLOCK *in_stack_00000b58;
  int in_stack_00000b64;
  int in_stack_00000b68;
  BLOCK_SIZE in_stack_00000b6f;
  AV1_COMP *in_stack_00000b70;
  RD_STATS *in_stack_00000ba0;
  int *in_stack_00000ba8;
  int in_stack_00000bb0;
  int64_t in_stack_00000bb8;
  uint *in_stack_00000bc0;
  uint in_stack_00000bc8;
  undefined4 uVar7;
  int **mvcost;
  int *in_stack_fffffffffffffbc0;
  undefined4 uVar8;
  int in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbcc;
  MACROBLOCK *in_stack_fffffffffffffbd0;
  AV1_COMP *in_stack_fffffffffffffbd8;
  undefined4 in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbe4;
  int *in_stack_fffffffffffffbe8;
  int in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffbf4;
  bool bsize_00;
  AV1_COMMON *in_stack_fffffffffffffbf8;
  MACROBLOCK *in_stack_fffffffffffffc00;
  int in_stack_fffffffffffffc08;
  undefined4 in_stack_fffffffffffffc0c;
  int in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc14;
  MACROBLOCK *in_stack_fffffffffffffc18;
  MACROBLOCK *in_stack_fffffffffffffc20;
  int in_stack_fffffffffffffc28;
  int in_stack_fffffffffffffc2c;
  AV1_COMP *in_stack_fffffffffffffc30;
  int in_stack_fffffffffffffc40;
  int *in_stack_fffffffffffffc48;
  undefined4 in_stack_fffffffffffffcd8;
  undefined1 uVar9;
  undefined4 in_stack_fffffffffffffce4;
  BLOCK_SIZE in_stack_fffffffffffffcef;
  SUBPEL_MOTION_SEARCH_PARAMS *in_stack_fffffffffffffcf0;
  AV1_COMMON *in_stack_fffffffffffffcf8;
  MACROBLOCKD *in_stack_fffffffffffffd00;
  WARP_SEARCH_METHOD in_stack_fffffffffffffd18;
  int in_stack_fffffffffffffd20;
  undefined1 local_2a8 [72];
  int_interpfilters local_260;
  char local_259;
  long local_258;
  int local_24c;
  undefined1 local_248 [176];
  undefined1 local_198 [180];
  uint local_e4;
  void *local_e0;
  void *local_d8;
  long local_d0;
  int local_c8;
  char local_c2 [2];
  uint local_c0;
  int local_bc;
  long local_b8;
  int local_b0;
  uint local_ac;
  int local_a8 [2];
  long alStack_a0 [2];
  byte abStack_90 [8];
  byte abStack_88 [56];
  MACROBLOCK *local_50;
  long local_48;
  MACROBLOCK *local_40;
  AV1_COMMON *local_38;
  byte local_29;
  int local_28;
  undefined4 local_24;
  int *local_20;
  long local_18;
  long local_10;
  
  local_38 = (AV1_COMMON *)(in_RDI + 0x3bf80);
  local_40 = (MACROBLOCK *)(in_RSI + 0x1a0);
  local_48 = in_RDI + 0x3c16c;
  local_50 = (MACROBLOCK *)**(undefined8 **)(in_RSI + 0x2058);
  local_29 = in_R9B;
  local_28 = in_R8D;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(local_a8,0,0x50);
  local_ac = 0;
  local_b0 = 0;
  local_b8 = 0x7fffffffffffffff;
  local_bc = -1;
  local_c0 = (uint)*(byte *)(local_48 + 0xd);
  local_c2[0] = '\0';
  local_c2[1] = '\x02';
  iVar2 = is_warped_mode_allowed
                    (in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
                     (MB_MODE_INFO *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  local_c8 = 1;
  if (iVar2 != 0) {
    local_c8 = 2;
  }
  local_d0 = local_18 + 0x15de0 +
             (long)(char)((macroblockd_plane *)&local_50->plane[0].qcoeff)->plane_type * 0x84;
  local_d8 = (void *)(local_d0 + 4);
  local_e0 = (void *)(local_d0 + 0x44);
  local_e4 = (uint)*(byte *)((long)&local_50->plane[0].coeff + 1);
  if (local_e4 == 0) {
    local_c8 = 1;
  }
  memcpy(local_198,local_50,0xb0);
  local_24c = 0;
  do {
    if (local_c8 <= local_24c) {
      memcpy(local_50,local_248,0xb0);
      *local_20 = local_a8[(long)local_bc * 10];
      *(long *)(local_20 + 2) = alStack_a0[(long)local_bc * 5];
      *(undefined8 *)(local_20 + 6) = *(undefined8 *)(abStack_88 + (long)local_bc * 0x28 + -8);
      bsize_00 = local_ac != 0 || local_b0 != 0;
      *(bool *)(local_20 + 8) = bsize_00;
      *in_stack_00000008 = local_b0;
      if (local_bc < 1) {
        av1_enc_build_inter_predictor
                  ((AV1_COMMON *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                   (MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                   (int)((ulong)in_stack_fffffffffffffc00 >> 0x20),(int)in_stack_fffffffffffffc00,
                   (BUFFER_SET *)in_stack_fffffffffffffbf8,bsize_00,(int)in_stack_fffffffffffffc20,
                   in_stack_fffffffffffffc28);
      }
      return;
    }
    local_258 = 0x7fffffffffffffff;
    local_259 = local_c2[local_24c];
    memcpy(local_50,local_198,0xb0);
    uVar8 = (undefined4)((ulong)in_stack_fffffffffffffbc0 >> 0x20);
    *(char *)&local_50->plane[0].coeff = local_259;
    if (local_259 == '\0') {
      in_stack_fffffffffffffc20 = local_50;
      local_260 = av1_broadcast_interp_filter(EIGHTTAP_REGULAR);
      ((macroblockd_plane *)&in_stack_fffffffffffffc20->plane[0].qcoeff)->subsampling_x =
           (int)local_260;
      av1_enc_build_inter_predictor
                ((AV1_COMMON *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                 (MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                 (int)((ulong)in_stack_fffffffffffffc00 >> 0x20),(int)in_stack_fffffffffffffc00,
                 (BUFFER_SET *)in_stack_fffffffffffffbf8,
                 (BLOCK_SIZE)((uint)in_stack_fffffffffffffbf4 >> 0x18),
                 (int)in_stack_fffffffffffffc20,in_stack_fffffffffffffc28);
      if (in_stack_00000010 == 0) {
        in_stack_fffffffffffffbc0 = (int *)0x0;
        model_rd_for_sb_y(in_stack_fffffffffffffc30,
                          (BLOCK_SIZE)((uint)in_stack_fffffffffffffc2c >> 0x18),
                          in_stack_fffffffffffffc20,(MACROBLOCKD *)in_stack_fffffffffffffc18,
                          (RD_STATS *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                          (uint *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                          in_stack_fffffffffffffc40,in_stack_fffffffffffffc48);
      }
      else {
        in_stack_fffffffffffffbc8 = 1;
        in_stack_fffffffffffffbd8 = (AV1_COMP *)0x0;
        in_stack_fffffffffffffbe0 = 0xffffffff;
        in_stack_fffffffffffffbc0 = in_stack_00000008;
        in_stack_fffffffffffffbd0 = in_stack_00000020;
        model_skip_for_sb_y_large
                  (in_stack_00000b70,in_stack_00000b6f,in_stack_00000b68,in_stack_00000b64,
                   in_stack_00000b58,in_stack_00000b50,in_stack_00000ba0,in_stack_00000ba8,
                   in_stack_00000bb0,in_stack_00000bb8,in_stack_00000bc0,in_stack_00000bc8);
      }
      iVar2 = av1_get_switchable_rate
                        ((MACROBLOCK *)in_stack_fffffffffffffbd8,
                         (MACROBLOCKD *)in_stack_fffffffffffffbd0,
                         (InterpFilter)((uint)in_stack_fffffffffffffbcc >> 0x18),
                         in_stack_fffffffffffffbc8);
      local_a8[(long)local_24c * 10] = iVar2 + local_a8[(long)local_24c * 10];
      local_258 = ((long)local_a8[(long)local_24c * 10] * (long)*(int *)(local_18 + 0x4218) + 0x100
                  >> 9) + alStack_a0[(long)local_24c * 5] * 0x80;
LAB_002fcf1e:
      if (local_258 < local_b8) {
        local_bc = local_24c;
        local_b8 = local_258;
        local_ac = (uint)abStack_88[(long)local_24c * 0x28];
        local_b0 = *in_stack_00000008;
        memcpy(local_248,local_50,0xb0);
      }
    }
    else {
      if (local_259 != '\x02') goto LAB_002fcf1e;
      lVar6 = local_18 + 0x4230;
      *(undefined1 *)((long)&local_50->plane[0].src.buf0 + 4) = 3;
      in_stack_fffffffffffffc18 = local_50;
      filter = av1_unswitchable_filter((InterpFilter)local_c0);
      iVar3 = av1_broadcast_interp_filter(filter);
      ((macroblockd_plane *)&in_stack_fffffffffffffc18->plane[0].qcoeff)->subsampling_x = (int)iVar3
      ;
      memcpy(local_2a8,local_d8,(long)(int)(local_e4 << 1) << 2);
      memcpy(&stack0xfffffffffffffd18,local_e0,(long)(int)(local_e4 << 1) << 2);
      if (1 < *(byte *)((long)&local_50->plane[0].coeff + 1)) {
        uVar1 = av1_selectSamples((MV *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0
                                                ),in_stack_fffffffffffffbe8,
                                  (int *)CONCAT44(in_stack_fffffffffffffbe4,
                                                  in_stack_fffffffffffffbe0),
                                  (int)((ulong)in_stack_fffffffffffffbd8 >> 0x20),
                                  (BLOCK_SIZE)((ulong)in_stack_fffffffffffffbd8 >> 0x18));
        *(uint8_t *)((long)&local_50->plane[0].coeff + 1) = uVar1;
      }
      uVar7 = (undefined4)((ulong)((long)&local_50->plane[0].coeff + 4) >> 0x20);
      in_stack_fffffffffffffbc0 = (int *)CONCAT44(uVar8,local_24);
      in_stack_fffffffffffffbc8 = local_28;
      iVar2 = av1_find_projection(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
                                  (int *)CONCAT44(in_stack_fffffffffffffbe4,
                                                  in_stack_fffffffffffffbe0),
                                  (BLOCK_SIZE)((ulong)in_stack_fffffffffffffbd8 >> 0x38),
                                  (int)in_stack_fffffffffffffbd8,
                                  (int)((ulong)in_stack_fffffffffffffbd0 >> 0x20),
                                  (WarpedMotionParams *)in_stack_fffffffffffffc00,
                                  in_stack_fffffffffffffc08,in_stack_fffffffffffffc10);
      uVar8 = (undefined4)((ulong)in_stack_fffffffffffffbc0 >> 0x20);
      if (iVar2 != 0) {
        local_258 = 0x7fffffffffffffff;
        goto LAB_002fcf1e;
      }
      if (*(char *)((long)&local_50->plane[0].src_diff + 2) != '\x10') {
LAB_002fccf8:
        in_stack_fffffffffffffc14 = CONCAT13(local_29,(int3)in_stack_fffffffffffffc14);
        in_stack_fffffffffffffbf8 = local_38;
        in_stack_fffffffffffffc00 = local_40;
        in_stack_fffffffffffffc0c = local_24;
        in_stack_fffffffffffffc10 = local_28;
        av1_num_planes(local_38);
        av1_enc_build_inter_predictor
                  ((AV1_COMMON *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                   (MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                   (int)((ulong)in_stack_fffffffffffffc00 >> 0x20),(int)in_stack_fffffffffffffc00,
                   (BUFFER_SET *)in_stack_fffffffffffffbf8,
                   (BLOCK_SIZE)((uint)in_stack_fffffffffffffbf4 >> 0x18),
                   (int)in_stack_fffffffffffffc20,in_stack_fffffffffffffc28);
        if (in_stack_00000010 == 0) {
          in_stack_fffffffffffffbc0 = (int *)0x0;
          model_rd_for_sb_y(in_stack_fffffffffffffc30,
                            (BLOCK_SIZE)((uint)in_stack_fffffffffffffc2c >> 0x18),
                            in_stack_fffffffffffffc20,(MACROBLOCKD *)in_stack_fffffffffffffc18,
                            (RD_STATS *)
                            CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                            (uint *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                            in_stack_fffffffffffffc40,in_stack_fffffffffffffc48);
        }
        else {
          in_stack_fffffffffffffbc8 = 1;
          in_stack_fffffffffffffbd8 = (AV1_COMP *)0x0;
          in_stack_fffffffffffffbe0 = 0xffffffff;
          in_stack_fffffffffffffbc0 = in_stack_00000008;
          in_stack_fffffffffffffbd0 = in_stack_00000020;
          model_skip_for_sb_y_large
                    (in_stack_00000b70,in_stack_00000b6f,in_stack_00000b68,in_stack_00000b64,
                     in_stack_00000b58,in_stack_00000b50,in_stack_00000ba0,in_stack_00000ba8,
                     in_stack_00000bb0,in_stack_00000bb8,in_stack_00000bc0,in_stack_00000bc8);
        }
        local_a8[(long)local_24c * 10] =
             *(int *)(lVar6 + 0x47d8 + (ulong)local_29 * 0xc +
                     (ulong)*(byte *)&local_50->plane[0].coeff * 4) + local_a8[(long)local_24c * 10]
        ;
        local_258 = ((long)local_a8[(long)local_24c * 10] * (long)*(int *)(local_18 + 0x4218) +
                     0x100 >> 9) + alStack_a0[(long)local_24c * 5] * 0x80;
        goto LAB_002fcf1e;
      }
      iVar2 = *(int *)&local_50->plane[0].dqcoeff;
      memcpy(&stack0xfffffffffffffce4,(void *)((long)&local_50->plane[0].coeff + 4),0x24);
      uVar4 = (uint)*(byte *)((long)&local_50->plane[0].coeff + 1);
      iVar5 = av1_get_ref_mv((MACROBLOCK *)in_stack_fffffffffffffbd8,
                             (int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
      av1_make_default_subpel_ms_params
                ((SUBPEL_MOTION_SEARCH_PARAMS *)
                 CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                 (AV1_COMP *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                 in_stack_fffffffffffffc00,(BLOCK_SIZE)((ulong)in_stack_fffffffffffffbf8 >> 0x38),
                 (MV *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                 in_stack_fffffffffffffbe8);
      in_stack_fffffffffffffbc8 = *(int *)(local_10 + 0x60a70);
      mvcost = (int **)CONCAT44(uVar7,local_e4);
      in_stack_fffffffffffffbc0 = (int *)CONCAT44(uVar8,(uint)*(byte *)(local_10 + 0x60a6c));
      av1_refine_warped_mv
                (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                 in_stack_fffffffffffffcef,(int *)CONCAT44(in_stack_fffffffffffffce4,uVar4),
                 (int *)CONCAT44(iVar5.as_int,in_stack_fffffffffffffcd8),(int)lVar6,
                 in_stack_fffffffffffffd18,in_stack_fffffffffffffd20);
      uVar9 = (undefined1)uVar4;
      if (*(uint32_t *)&local_50->plane[0].dqcoeff != iVar5.as_int) {
        if (iVar2 == *(int *)&local_50->plane[0].dqcoeff) {
          *(int *)&local_50->plane[0].dqcoeff = iVar2;
          memcpy((void *)((long)&local_50->plane[0].coeff + 4),&stack0xfffffffffffffce4,0x24);
          *(undefined1 *)((long)&local_50->plane[0].coeff + 1) = uVar9;
        }
        else {
          in_stack_fffffffffffffc2c =
               av1_mv_bit_cost((MV *)in_stack_fffffffffffffbd0,
                               (MV *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                               in_stack_fffffffffffffbc0,mvcost,0);
          *in_stack_00000018 = in_stack_fffffffffffffc2c;
        }
        goto LAB_002fccf8;
      }
    }
    local_24c = local_24c + 1;
  } while( true );
}

Assistant:

static void search_motion_mode(AV1_COMP *cpi, MACROBLOCK *x, RD_STATS *this_rdc,
                               int mi_row, int mi_col, BLOCK_SIZE bsize,
                               int *this_early_term, int use_model_yrd_large,
                               int *rate_mv, int64_t best_sse) {
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *const xd = &x->e_mbd;
  const FeatureFlags *const features = &cm->features;
  MB_MODE_INFO *const mi = xd->mi[0];
  RD_STATS pf_rd_stats[MOTION_MODE_SEARCH_SIZE] = { 0 };
  int best_skip = 0;
  int best_early_term = 0;
  int64_t best_cost = INT64_MAX;
  int best_mode_index = -1;
  const int interp_filter = features->interp_filter;

  const MOTION_MODE motion_modes[MOTION_MODE_SEARCH_SIZE] = {
    SIMPLE_TRANSLATION, WARPED_CAUSAL
  };
  int mode_search_size = is_warped_mode_allowed(cpi, x, mi) ? 2 : 1;

  WARP_SAMPLE_INFO *const warp_sample_info =
      &x->warp_sample_info[mi->ref_frame[0]];
  int *pts0 = warp_sample_info->pts;
  int *pts_inref0 = warp_sample_info->pts_inref;

  const int total_samples = mi->num_proj_ref;
  if (total_samples == 0) {
    // Do not search WARPED_CAUSAL if there are no samples to use to determine
    // warped parameters.
    mode_search_size = 1;
  }

  const MB_MODE_INFO base_mbmi = *mi;
  MB_MODE_INFO best_mbmi;

  for (int mode_index = 0; mode_index < mode_search_size; ++mode_index) {
    int64_t cost = INT64_MAX;
    MOTION_MODE motion_mode = motion_modes[mode_index];
    *mi = base_mbmi;
    mi->motion_mode = motion_mode;
    if (motion_mode == SIMPLE_TRANSLATION) {
      mi->interp_filters = av1_broadcast_interp_filter(EIGHTTAP_REGULAR);

      av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, NULL, bsize,
                                    AOM_PLANE_Y, AOM_PLANE_Y);
      if (use_model_yrd_large)
        model_skip_for_sb_y_large(cpi, bsize, mi_row, mi_col, x, xd,
                                  &pf_rd_stats[mode_index], this_early_term, 1,
                                  best_sse, NULL, UINT_MAX);
      else
        model_rd_for_sb_y(cpi, bsize, x, xd, &pf_rd_stats[mode_index], NULL, 1,
                          NULL);
      pf_rd_stats[mode_index].rate +=
          av1_get_switchable_rate(x, xd, cm->features.interp_filter,
                                  cm->seq_params->enable_dual_filter);
      cost = RDCOST(x->rdmult, pf_rd_stats[mode_index].rate,
                    pf_rd_stats[mode_index].dist);
    } else if (motion_mode == WARPED_CAUSAL) {
      int pts[SAMPLES_ARRAY_SIZE], pts_inref[SAMPLES_ARRAY_SIZE];
      const ModeCosts *mode_costs = &x->mode_costs;
      mi->wm_params.wmtype = DEFAULT_WMTYPE;
      mi->interp_filters =
          av1_broadcast_interp_filter(av1_unswitchable_filter(interp_filter));

      memcpy(pts, pts0, total_samples * 2 * sizeof(*pts0));
      memcpy(pts_inref, pts_inref0, total_samples * 2 * sizeof(*pts_inref0));
      // Select the samples according to motion vector difference
      if (mi->num_proj_ref > 1) {
        mi->num_proj_ref = av1_selectSamples(&mi->mv[0].as_mv, pts, pts_inref,
                                             mi->num_proj_ref, bsize);
      }

      // Compute the warped motion parameters with a least squares fit
      //  using the collected samples
      if (!av1_find_projection(mi->num_proj_ref, pts, pts_inref, bsize,
                               mi->mv[0].as_mv.row, mi->mv[0].as_mv.col,
                               &mi->wm_params, mi_row, mi_col)) {
        if (mi->mode == NEWMV) {
          const int_mv mv0 = mi->mv[0];
          const WarpedMotionParams wm_params0 = mi->wm_params;
          const int num_proj_ref0 = mi->num_proj_ref;

          const int_mv ref_mv = av1_get_ref_mv(x, 0);
          SUBPEL_MOTION_SEARCH_PARAMS ms_params;
          av1_make_default_subpel_ms_params(&ms_params, cpi, x, bsize,
                                            &ref_mv.as_mv, NULL);

          // Refine MV in a small range.
          av1_refine_warped_mv(xd, cm, &ms_params, bsize, pts0, pts_inref0,
                               total_samples, cpi->sf.mv_sf.warp_search_method,
                               cpi->sf.mv_sf.warp_search_iters);
          if (mi->mv[0].as_int == ref_mv.as_int) {
            continue;
          }

          if (mv0.as_int != mi->mv[0].as_int) {
            // Keep the refined MV and WM parameters.
            int tmp_rate_mv = av1_mv_bit_cost(
                &mi->mv[0].as_mv, &ref_mv.as_mv, x->mv_costs->nmv_joint_cost,
                x->mv_costs->mv_cost_stack, MV_COST_WEIGHT);
            *rate_mv = tmp_rate_mv;
          } else {
            // Restore the old MV and WM parameters.
            mi->mv[0] = mv0;
            mi->wm_params = wm_params0;
            mi->num_proj_ref = num_proj_ref0;
          }
        }
        // Build the warped predictor
        av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, NULL, bsize,
                                      AOM_PLANE_Y, av1_num_planes(cm) - 1);
        if (use_model_yrd_large)
          model_skip_for_sb_y_large(cpi, bsize, mi_row, mi_col, x, xd,
                                    &pf_rd_stats[mode_index], this_early_term,
                                    1, best_sse, NULL, UINT_MAX);
        else
          model_rd_for_sb_y(cpi, bsize, x, xd, &pf_rd_stats[mode_index], NULL,
                            1, NULL);

        pf_rd_stats[mode_index].rate +=
            mode_costs->motion_mode_cost[bsize][mi->motion_mode];
        cost = RDCOST(x->rdmult, pf_rd_stats[mode_index].rate,
                      pf_rd_stats[mode_index].dist);
      } else {
        cost = INT64_MAX;
      }
    }
    if (cost < best_cost) {
      best_mode_index = mode_index;
      best_cost = cost;
      best_skip = pf_rd_stats[mode_index].skip_txfm;
      best_early_term = *this_early_term;
      best_mbmi = *mi;
    }
  }
  assert(best_mode_index >= 0 && best_mode_index < FILTER_SEARCH_SIZE);

  *mi = best_mbmi;
  this_rdc->rate = pf_rd_stats[best_mode_index].rate;
  this_rdc->dist = pf_rd_stats[best_mode_index].dist;
  this_rdc->sse = pf_rd_stats[best_mode_index].sse;
  this_rdc->skip_txfm = (best_skip || best_early_term);
  *this_early_term = best_early_term;
  if (best_mode_index < FILTER_SEARCH_SIZE - 1) {
    av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, NULL, bsize,
                                  AOM_PLANE_Y, AOM_PLANE_Y);
  }
}